

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix2.c
# Opt level: O0

char * test_matrix2_zero(void)

{
  short sVar1;
  byte local_21;
  undefined1 local_20 [7];
  uint8_t i;
  matrix2 zero;
  
  matrix2_zero((matrix2 *)local_20);
  local_21 = 0;
  while( true ) {
    if (3 < local_21) {
      return (char *)0x0;
    }
    sVar1 = scalar_equalsf(*(float *)(local_20 + (ulong)local_21 * 4),0.0);
    if (sVar1 == 0) break;
    local_21 = local_21 + 1;
  }
  return 
  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix2.c(11) : (assertion failed) ((scalar_equalsf(zero.m[i], 0.0f)))"
  ;
}

Assistant:

static char *test_matrix2_zero(void)
{
	struct matrix2 zero;
	uint8_t i;

	matrix2_zero(&zero);

	for (i = 0; i < 4; i++) {
		test_assert(scalar_equalsf(zero.m[i], 0.0f));
	}

	return NULL;
}